

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall soplex::SPxScaler<double>::maxAbsColscale(SPxScaler<double> *this)

{
  DataArray<int> *this_00;
  int iVar1;
  long in_RDI;
  Real RVar2;
  int i;
  double maxi;
  DataArray<int> *colscaleExp;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  int n;
  undefined8 local_18;
  
  this_00 = *(DataArray<int> **)(in_RDI + 0x10);
  local_18 = 0.0;
  iVar3 = 0;
  while( true ) {
    n = iVar3;
    iVar1 = DataArray<int>::size(this_00);
    if (iVar1 <= iVar3) break;
    DataArray<int>::operator[](this_00,n);
    RVar2 = spxLdexp((Real)CONCAT44(n,iVar3),in_stack_ffffffffffffffdc);
    RVar2 = spxAbs<double>(RVar2);
    if (local_18 < RVar2) {
      DataArray<int>::operator[](this_00,n);
      RVar2 = spxLdexp((Real)CONCAT44(n,iVar3),in_stack_ffffffffffffffdc);
      local_18 = spxAbs<double>(RVar2);
    }
    iVar3 = n + 1;
  }
  return local_18;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}